

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManPrepareGroups(Llb_Man_t *pMan)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pAVar3;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Llb_Man_t *pMan_local;
  
  if (pMan->vGroups != (Vec_Ptr_t *)0x0) {
    __assert_fail("pMan->vGroups == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                  ,0x168,"void Llb_ManPrepareGroups(Llb_Man_t *)");
  }
  pVVar2 = Vec_PtrAlloc(1000);
  pMan->vGroups = pVVar2;
  Llb_ManGroupCreateFirst(pMan);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pMan->pAig->vObjs), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->pAig->vObjs,local_1c);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) &&
       ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0)) {
      Llb_ManGroupCreate(pMan,pAVar3);
    }
  }
  for (local_1c = 0; iVar1 = Saig_ManRegNum(pMan->pAig), local_1c < iVar1; local_1c = local_1c + 1)
  {
    pVVar2 = pMan->pAig->vCos;
    iVar1 = Saig_ManPoNum(pMan->pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,local_1c + iVar1);
    if ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0) {
      Llb_ManGroupCreate(pMan,pAVar3);
    }
  }
  Llb_ManGroupCreateLast(pMan);
  return;
}

Assistant:

void Llb_ManPrepareGroups( Llb_Man_t * pMan )
{
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->vGroups == NULL );
    pMan->vGroups = Vec_PtrAlloc( 1000 );
    Llb_ManGroupCreateFirst( pMan );
    Aig_ManForEachNode( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Saig_ManForEachLi( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Llb_ManGroupCreateLast( pMan );
}